

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioReadPlaMo.c
# Opt level: O3

int Mop_ManMergeDist1Pairs2(Mop_Man_t *p,Vec_Int_t *vGroup,Vec_Int_t *vGroupPrev)

{
  word *__s1;
  int iVar1;
  int Entry;
  int iVar2;
  uint uVar3;
  word *pwVar4;
  word *pwVar5;
  word *pwVar6;
  bool bVar7;
  uint uVar8;
  uint uVar9;
  int iVar10;
  long lVar11;
  ulong uVar12;
  ulong uVar13;
  uint uVar14;
  ulong uVar15;
  uint uVar16;
  long lVar17;
  int *piVar18;
  long lVar19;
  long lVar20;
  long lVar21;
  int local_7c;
  
  uVar9 = vGroup->nSize;
  if (0 < (int)uVar9) {
    piVar18 = vGroup->pArray;
    lVar19 = 0;
    lVar20 = 1;
    local_7c = 0;
    do {
      iVar1 = piVar18[lVar19];
      if (iVar1 != -1) {
        uVar14 = p->nWordsIn * iVar1;
        if (((int)uVar14 < 0) || (p->vWordsIn->nSize <= (int)uVar14)) {
LAB_00337bb1:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecWrd.h"
                        ,0x1be,"word *Vec_WrdEntryP(Vec_Wrd_t *, int)");
        }
        if (lVar19 + 1 < (long)(int)uVar9) {
          pwVar4 = p->vWordsIn->pArray;
          lVar21 = lVar20;
LAB_00337858:
          Entry = piVar18[lVar21];
          if (Entry == -1) goto LAB_00337a7e;
          uVar9 = p->nWordsIn;
          uVar13 = (ulong)uVar9;
          uVar8 = uVar9 * Entry;
          if (((int)uVar8 < 0) || (p->vWordsIn->nSize <= (int)uVar8)) goto LAB_00337bb1;
          if ((int)uVar9 < 1) goto LAB_00337a7e;
          pwVar5 = p->vWordsIn->pArray;
          bVar7 = true;
          uVar12 = 0;
          do {
            while( true ) {
              uVar15 = uVar12 + 1;
              if (pwVar4[uVar14 + uVar12] != pwVar5[uVar8 + uVar12]) break;
              uVar12 = uVar15;
              if (uVar15 == uVar13) {
                if (bVar7) goto LAB_00337a7e;
                goto LAB_00337978;
              }
            }
            uVar12 = pwVar5[uVar8 + uVar12] ^ pwVar4[uVar14 + uVar12];
            if (((((uVar12 >> 1 ^ uVar12) & 0x5555555555555555) != 0) ||
                (uVar12 = uVar12 & 0x5555555555555555 & uVar12 >> 1, (bool)~bVar7 || uVar12 == 0))
               || (uVar12 = (uVar12 >> 2 & 0x3333333333333333) + (uVar12 & 0x3333333333333333),
                  1 < (byte)(((uVar12 >> 4) + uVar12 & 0xf0f0f0f0f0f0f0f) * 0x101010101010101 >>
                            0x38))) goto LAB_00337a7e;
            bVar7 = false;
            uVar12 = uVar15;
          } while (uVar15 != uVar13);
LAB_00337978:
          iVar2 = p->nWordsOut;
          lVar17 = (long)iVar2;
          uVar9 = iVar2 * iVar1;
          if (-1 < (int)uVar9) {
            uVar3 = p->vWordsOut->nSize;
            if ((((int)uVar9 < (int)uVar3) && (uVar16 = iVar2 * Entry, -1 < (int)uVar16)) &&
               (uVar16 < uVar3)) {
              pwVar6 = p->vWordsOut->pArray;
              __s1 = pwVar6 + uVar9;
              pwVar6 = pwVar6 + uVar16;
              iVar10 = bcmp(__s1,pwVar6,lVar17 * 8);
              if (iVar10 == 0) {
                __assert_fail("memcmp(pCube1Out, pCube2Out, sizeof(word)*p->nWordsOut)",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/io/ioReadPlaMo.c"
                              ,0x226,
                              "int Mop_ManMergeDist1Pairs2(Mop_Man_t *, Vec_Int_t *, Vec_Int_t *)");
              }
              if (0 < iVar2) {
                lVar11 = 0;
                do {
                  if ((pwVar6[lVar11] & ~__s1[lVar11]) != 0) {
                    lVar11 = 0;
                    goto LAB_00337a94;
                  }
                  lVar11 = lVar11 + 1;
                } while (lVar17 != lVar11);
              }
              uVar12 = 0;
              do {
                pwVar5[uVar8 + uVar12] = pwVar5[uVar8 + uVar12] & pwVar4[uVar14 + uVar12];
                uVar12 = uVar12 + 1;
              } while (uVar13 != uVar12);
              if (0 < iVar2) {
                lVar11 = 0;
                do {
                  __s1[lVar11] = __s1[lVar11] & ~pwVar6[lVar11];
                  lVar11 = lVar11 + 1;
                } while (lVar17 != lVar11);
              }
              Vec_IntPush(vGroupPrev,Entry);
              lVar17 = lVar21;
              if (lVar21 < vGroup->nSize) goto LAB_00337a60;
              goto LAB_00337bef;
            }
          }
          goto LAB_00337bb1;
        }
      }
LAB_00337b43:
      lVar19 = lVar19 + 1;
      lVar20 = lVar20 + 1;
    } while (lVar19 < (int)uVar9);
    if (local_7c != 0) {
      if ((int)uVar9 < 1) {
        uVar14 = 0;
      }
      else {
        piVar18 = vGroup->pArray;
        lVar19 = 0;
        uVar14 = 0;
        do {
          iVar1 = piVar18[lVar19];
          if (iVar1 != -1) {
            if (((int)uVar14 < 0) || (uVar9 <= uVar14)) {
LAB_00337bef:
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                            ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
            }
            uVar13 = (ulong)uVar14;
            uVar14 = uVar14 + 1;
            piVar18[uVar13] = iVar1;
            uVar9 = vGroup->nSize;
          }
          lVar19 = lVar19 + 1;
        } while (lVar19 < (int)uVar9);
      }
      if ((int)uVar14 <= (int)uVar9) {
        vGroup->nSize = uVar14;
        return local_7c;
      }
      __assert_fail("p->nSize >= nSizeNew",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                    ,0x2b7,"void Vec_IntShrink(Vec_Int_t *, int)");
    }
  }
  return 0;
  while (lVar11 = lVar11 + 1, lVar17 != lVar11) {
LAB_00337a94:
    if ((__s1[lVar11] & ~pwVar6[lVar11]) != 0) goto LAB_00337a7e;
  }
  uVar12 = 0;
  do {
    pwVar4[uVar14 + uVar12] = pwVar4[uVar14 + uVar12] & pwVar5[uVar8 + uVar12];
    uVar12 = uVar12 + 1;
  } while (uVar13 != uVar12);
  lVar11 = 0;
  do {
    pwVar6[lVar11] = pwVar6[lVar11] & ~__s1[lVar11];
    lVar11 = lVar11 + 1;
  } while (lVar17 != lVar11);
  Vec_IntPush(vGroupPrev,iVar1);
  lVar17 = lVar19;
  if (vGroup->nSize <= lVar19) goto LAB_00337bef;
LAB_00337a60:
  piVar18 = vGroup->pArray;
  piVar18[lVar17] = -1;
  local_7c = local_7c + 1;
LAB_00337a7e:
  lVar21 = lVar21 + 1;
  uVar9 = vGroup->nSize;
  if ((int)uVar9 <= (int)lVar21) goto LAB_00337b43;
  goto LAB_00337858;
}

Assistant:

int Mop_ManMergeDist1Pairs2( Mop_Man_t * p, Vec_Int_t * vGroup, Vec_Int_t * vGroupPrev )
{
    int w, c1, c2, iCube1, iCube2, Count = 0;
    Vec_IntForEachEntry( vGroup, iCube1, c1 )
    if ( iCube1 != -1 )
    {
        word * pCube1Out, * pCube1 = Mop_ManCubeIn( p, iCube1 );
        Vec_IntForEachEntryStart( vGroup, iCube2, c2, c1+1 )
        if ( iCube2 != -1 )
        {
            word * pCube2Out, * pCube2 = Mop_ManCubeIn( p, iCube2 );
            if ( !Mop_ManCheckDist1(pCube1, pCube2, p->nWordsIn) )
                continue;
            pCube1Out = Mop_ManCubeOut( p, iCube1 );
            pCube2Out = Mop_ManCubeOut( p, iCube2 );
            assert( memcmp(pCube1Out, pCube2Out, sizeof(word)*p->nWordsOut) );
            if ( Mop_ManCheckContain(pCube1Out, pCube2Out, p->nWordsOut) ) // pCube1 has more outputs
            {
                // update the input part
                for ( w = 0; w < p->nWordsIn; w++ )
                    pCube2[w] &= pCube1[w];
                // sharp the output part
                for ( w = 0; w < p->nWordsOut; w++ )
                    pCube1Out[w] &= ~pCube2Out[w];
                // move to another group
                Vec_IntPush( vGroupPrev, iCube2 );
                Vec_IntWriteEntry( vGroup, c2, -1 );
                Count++;
            }
            else if ( Mop_ManCheckContain(pCube2Out, pCube1Out, p->nWordsOut) ) // pCube2 has more outputs
            {
                // update the input part
                for ( w = 0; w < p->nWordsIn; w++ )
                    pCube1[w] &= pCube2[w];
                // sharp the output part
                for ( w = 0; w < p->nWordsOut; w++ )
                    pCube2Out[w] &= ~pCube1Out[w];
                // move to another group
                Vec_IntPush( vGroupPrev, iCube1 );
                Vec_IntWriteEntry( vGroup, c1, -1 );
                Count++;
            }
        }
    }
    if ( Count )
        Map_ManGroupCompact( vGroup );
    return Count;
}